

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

uint32_t __thiscall
slang::IntervalMapDetails::
NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
::find(NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>_>
       *this,uint32_t size,interval<unsigned_long> *key)

{
  interval<unsigned_long> *piVar1;
  ulong *in_RDX;
  uint32_t in_ESI;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *in_RDI;
  bool bVar2;
  uint32_t i;
  LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true> *self;
  uint32_t local_24;
  
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 != in_ESI) {
      piVar1 = LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_true>::keyAt
                         (in_RDI,local_24);
      bVar2 = piVar1->left < *in_RDX;
    }
    if (!bVar2) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

uint32_t find(uint32_t size, const interval<TKey>& key) const {
        SLANG_ASSERT(size <= TDerived::Capacity);
        auto& self = *static_cast<const TDerived*>(this);
        uint32_t i = 0;
        while (i != size && self.keyAt(i).left < key.left)
            i++;
        return i;
    }